

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

bool __thiscall crnlib::dxt_image::flip_x(dxt_image *this)

{
  undefined8 uVar1;
  uint block_x;
  uint uVar2;
  uint uVar3;
  element_type eVar4;
  element *peVar5;
  dxt_image *in_RDI;
  element tmp;
  uint e;
  uint y;
  uint w;
  uint x;
  uint mid_x;
  uint in_stack_ffffffffffffffd8;
  uint uVar6;
  uint element_index;
  uint block_y;
  uint local_18;
  dxt_image *this_00;
  bool local_1;
  
  if ((((in_RDI->m_format == cETC1) || (in_RDI->m_format == cETC2)) || (in_RDI->m_format == cETC2A))
     || ((in_RDI->m_format == cETC1S || (in_RDI->m_format == cETC2AS)))) {
    local_1 = false;
  }
  else if (((in_RDI->m_width & 3) == 0) || (in_RDI->m_width < 5)) {
    if (in_RDI->m_width == 1) {
      local_1 = true;
    }
    else {
      block_x = in_RDI->m_blocks_x >> 1;
      this_00 = in_RDI;
      for (local_18 = 0; local_18 < block_x; local_18 = local_18 + 1) {
        flip_col(this_00,block_x);
      }
      if ((in_RDI->m_blocks_x & 1) != 0) {
        uVar2 = math::minimum<unsigned_int>(in_RDI->m_width,4);
        for (block_y = 0; block_y < in_RDI->m_blocks_y; block_y = block_y + 1) {
          uVar6 = 0;
          while (element_index = uVar6, uVar3 = get_elements_per_block(in_RDI), uVar6 < uVar3) {
            peVar5 = get_element(in_RDI,block_x,block_y,element_index);
            uVar1 = *(undefined8 *)peVar5->m_bytes;
            eVar4 = get_element_type(in_RDI,element_index);
            if (eVar4 == cColorDXT1) {
              dxt1_block::flip_x((dxt1_block *)CONCAT44(uVar2,block_y),element_index,
                                 in_stack_ffffffffffffffd8);
            }
            else if (eVar4 == cAlphaDXT3) {
              dxt3_block::flip_x((dxt3_block *)CONCAT44(uVar2,block_y),element_index,
                                 in_stack_ffffffffffffffd8);
            }
            else if (eVar4 == cAlphaDXT5) {
              dxt5_block::flip_x((dxt5_block *)CONCAT44(uVar2,block_y),element_index,
                                 in_stack_ffffffffffffffd8);
            }
            peVar5 = get_element(in_RDI,block_x,block_y,element_index);
            *(undefined8 *)peVar5->m_bytes = uVar1;
            uVar6 = element_index + 1;
          }
        }
      }
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool dxt_image::flip_x() {
  if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS) {
    // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
    return false;
  }

  if ((m_width & 3) && (m_width > 4))
    return false;

  if (m_width == 1)
    return true;

  const uint mid_x = m_blocks_x / 2;

  for (uint x = 0; x < mid_x; x++)
    flip_col(x);

  if (m_blocks_x & 1) {
    const uint w = math::minimum(m_width, 4U);
    for (uint y = 0; y < m_blocks_y; y++) {
      for (uint e = 0; e < get_elements_per_block(); e++) {
        element tmp(get_element(mid_x, y, e));
        switch (get_element_type(e)) {
          case cColorDXT1:
            reinterpret_cast<dxt1_block*>(&tmp)->flip_x(w, 4);
            break;
          case cAlphaDXT3:
            reinterpret_cast<dxt3_block*>(&tmp)->flip_x(w, 4);
            break;
          case cAlphaDXT5:
            reinterpret_cast<dxt5_block*>(&tmp)->flip_x(w, 4);
            break;
          default:
            CRNLIB_ASSERT(0);
            break;
        }
        get_element(mid_x, y, e) = tmp;
      }
    }
  }

  return true;
}